

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cc
# Opt level: O3

double FIX::double_conversion::RadixStringToIeee<3,char*>
                 (char **current,char *end,bool sign,bool allow_trailing_junk,
                 double junk_string_value,bool read_as_double,bool *result_is_junk)

{
  char cVar1;
  sbyte sVar2;
  byte bVar3;
  int iVar4;
  undefined7 in_register_00000011;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  Double *this;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  char *pcVar11;
  bool bVar12;
  double dVar13;
  DiyFp diy_fp;
  
  diy_fp._9_7_ = in_register_00000011;
  diy_fp.e_._0_1_ = sign;
  pcVar11 = *current;
  if (pcVar11 == end) {
    __assert_fail("*current != end",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                  ,0x21d,
                  "double FIX::double_conversion::RadixStringToIeee(Iterator *, Iterator, bool, bool, double, bool, bool *) [radix_log_2 = 3, Iterator = char *]"
                 );
  }
  *result_is_junk = true;
  do {
    if (*pcVar11 != '0') {
      sVar2 = 0x18;
      if (read_as_double) {
        sVar2 = 0x35;
      }
      this = (Double *)0x0;
      goto LAB_0016928a;
    }
    pcVar11 = pcVar11 + 1;
    *current = pcVar11;
  } while (pcVar11 != end);
  *result_is_junk = false;
  if (!sign) {
    return 0.0;
  }
  goto LAB_00169413;
LAB_0016928a:
  iVar4 = (int)*pcVar11;
  if ((0x37 < iVar4) || (9 < iVar4 - 0x30U)) {
    if (pcVar11 != end && !allow_trailing_junk) goto LAB_00169344;
    goto LAB_001692cd;
  }
  this = (Double *)((long)iVar4 + (long)this * 8 + -0x30);
  uVar8 = (long)this >> sVar2;
  if ((int)uVar8 == 0) goto code_r0x001692b5;
  iVar4 = 1;
  if (1 < (int)uVar8) {
    uVar9 = uVar8 & 0xffffffff;
    do {
      iVar4 = iVar4 + 1;
      uVar9 = uVar9 >> 1;
      uVar6 = (uint)uVar8;
      uVar8 = uVar9;
    } while (3 < uVar6);
  }
  bVar3 = (byte)iVar4;
  uVar8 = (long)this >> (bVar3 & 0x3f);
  pcVar11 = pcVar11 + 1;
  *current = pcVar11;
  bVar5 = 1;
  do {
    if (pcVar11 == end) {
LAB_00169377:
      uVar7 = (uint)this & ~(-1 << (bVar3 & 0x1f));
      uVar6 = 1 << (bVar3 - 1 & 0x1f);
      if ((int)uVar6 < (int)uVar7) {
        uVar8 = uVar8 + 1;
      }
      else if (uVar7 == uVar6) {
        uVar8 = uVar8 + ((byte)(~bVar5 | (byte)uVar8) & 1);
      }
      bVar12 = (uVar8 >> sVar2 & 1) != 0;
      uVar6 = iVar4 + (uint)bVar12;
      this = (Double *)((long)uVar8 >> bVar12);
      goto LAB_001693b3;
    }
    cVar1 = *pcVar11;
    if ((0x37 < cVar1) || (9 < (int)cVar1 - 0x30U)) {
      if (!allow_trailing_junk) {
        do {
          lVar10 = 0;
          while ((&kWhitespaceTable7)[lVar10] != *pcVar11) {
            lVar10 = lVar10 + 1;
            if (lVar10 == 6) {
              return junk_string_value;
            }
          }
          pcVar11 = pcVar11 + 1;
          *current = pcVar11;
        } while (pcVar11 != end);
      }
      goto LAB_00169377;
    }
    bVar5 = bVar5 & cVar1 == '0';
    iVar4 = iVar4 + 3;
    pcVar11 = pcVar11 + 1;
    *current = pcVar11;
  } while( true );
code_r0x001692b5:
  pcVar11 = pcVar11 + 1;
  *current = pcVar11;
  if (pcVar11 == end) goto LAB_001692cd;
  goto LAB_0016928a;
LAB_001692cd:
  uVar6 = 0;
  goto LAB_001693b3;
LAB_00169344:
  do {
    lVar10 = 0;
    while ((&kWhitespaceTable7)[lVar10] != *pcVar11) {
      lVar10 = lVar10 + 1;
      if (lVar10 == 6) {
        return junk_string_value;
      }
    }
    pcVar11 = pcVar11 + 1;
    *current = pcVar11;
    uVar6 = 0;
  } while (pcVar11 != end);
LAB_001693b3:
  if (1L << sVar2 <= (long)this) {
    __assert_fail("number < ((int64_t)1 << kSignificandSize)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                  ,0x273,
                  "double FIX::double_conversion::RadixStringToIeee(Iterator *, Iterator, bool, bool, double, bool, bool *) [radix_log_2 = 3, Iterator = char *]"
                 );
  }
  dVar13 = (double)(long)this;
  if (this != (Double *)(long)dVar13) {
    __assert_fail("static_cast<int64_t>(static_cast<double>(number)) == number",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                  ,0x274,
                  "double FIX::double_conversion::RadixStringToIeee(Iterator *, Iterator, bool, bool, double, bool, bool *) [radix_log_2 = 3, Iterator = char *]"
                 );
  }
  *result_is_junk = false;
  if (uVar6 == 0) {
    if (sign) {
      if (this == (Double *)0x0) {
LAB_00169413:
        dVar13 = -0.0;
      }
      else {
        dVar13 = (double)-(long)this;
      }
    }
  }
  else {
    if (this == (Double *)0x0) {
      __assert_fail("number != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                    ,0x280,
                    "double FIX::double_conversion::RadixStringToIeee(Iterator *, Iterator, bool, bool, double, bool, bool *) [radix_log_2 = 3, Iterator = char *]"
                   );
    }
    diy_fp.f_ = (ulong)uVar6;
    dVar13 = (double)Double::DiyFpToUint64(this,diy_fp);
  }
  return dVar13;
}

Assistant:

static double RadixStringToIeee(Iterator* current,
                                Iterator end,
                                bool sign,
                                bool allow_trailing_junk,
                                double junk_string_value,
                                bool read_as_double,
                                bool* result_is_junk) {
  ASSERT(*current != end);

  const int kDoubleSize = Double::kSignificandSize;
  const int kSingleSize = Single::kSignificandSize;
  const int kSignificandSize = read_as_double? kDoubleSize: kSingleSize;

  *result_is_junk = true;

  // Skip leading 0s.
  while (**current == '0') {
    ++(*current);
    if (*current == end) {
      *result_is_junk = false;
      return SignedZero(sign);
    }
  }

  int64_t number = 0;
  int exponent = 0;
  const int radix = (1 << radix_log_2);

  do {
    int digit;
    if (IsDecimalDigitForRadix(**current, radix)) {
      digit = static_cast<char>(**current) - '0';
    } else if (IsCharacterDigitForRadix(**current, radix, 'a')) {
      digit = static_cast<char>(**current) - 'a' + 10;
    } else if (IsCharacterDigitForRadix(**current, radix, 'A')) {
      digit = static_cast<char>(**current) - 'A' + 10;
    } else {
      if (allow_trailing_junk || !AdvanceToNonspace(current, end)) {
        break;
      } else {
        return junk_string_value;
      }
    }

    number = number * radix + digit;
    int overflow = static_cast<int>(number >> kSignificandSize);
    if (overflow != 0) {
      // Overflow occurred. Need to determine which direction to round the
      // result.
      int overflow_bits_count = 1;
      while (overflow > 1) {
        overflow_bits_count++;
        overflow >>= 1;
      }

      int dropped_bits_mask = ((1 << overflow_bits_count) - 1);
      int dropped_bits = static_cast<int>(number) & dropped_bits_mask;
      number >>= overflow_bits_count;
      exponent = overflow_bits_count;

      bool zero_tail = true;
      for (;;) {
        ++(*current);
        if (*current == end || !isDigit(**current, radix)) break;
        zero_tail = zero_tail && **current == '0';
        exponent += radix_log_2;
      }

      if (!allow_trailing_junk && AdvanceToNonspace(current, end)) {
        return junk_string_value;
      }

      int middle_value = (1 << (overflow_bits_count - 1));
      if (dropped_bits > middle_value) {
        number++;  // Rounding up.
      } else if (dropped_bits == middle_value) {
        // Rounding to even to consistency with decimals: half-way case rounds
        // up if significant part is odd and down otherwise.
        if ((number & 1) != 0 || !zero_tail) {
          number++;  // Rounding up.
        }
      }

      // Rounding up may cause overflow.
      if ((number & ((int64_t)1 << kSignificandSize)) != 0) {
        exponent++;
        number >>= 1;
      }
      break;
    }
    ++(*current);
  } while (*current != end);

  ASSERT(number < ((int64_t)1 << kSignificandSize));
  ASSERT(static_cast<int64_t>(static_cast<double>(number)) == number);

  *result_is_junk = false;

  if (exponent == 0) {
    if (sign) {
      if (number == 0) return -0.0;
      number = -number;
    }
    return static_cast<double>(number);
  }

  ASSERT(number != 0);
  return Double(DiyFp(number, exponent)).value();
}